

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int relocatePage(BtShared *pBt,MemPage *pDbPage,u8 eType,Pgno iPtrPage,Pgno iFreePage,int isCommit)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  Pgno PVar4;
  Pager *pPager;
  PgHdr *pPg;
  int iVar5;
  u32 uVar6;
  DbPage *p;
  ulong uVar7;
  uint *puVar8;
  u8 *puVar9;
  int local_5c;
  Pgno local_58;
  Pgno local_54;
  CellInfo local_50;
  MemPage *pPtrPage;
  
  uVar3 = pDbPage->pgno;
  if (uVar3 < 3) {
    iVar5 = 0x10516;
LAB_00137ddc:
    iVar5 = sqlite3CorruptError(iVar5);
    return iVar5;
  }
  pPager = pBt->pPager;
  pPg = pDbPage->pDbPage;
  local_54 = iPtrPage;
  if ((pPager->tempFile != '\0') && (iVar5 = sqlite3PagerWrite(pPg), iVar5 != 0)) {
    return iVar5;
  }
  uVar2 = pPg->flags;
  if ((uVar2 & 2) != 0) {
    iVar5 = subjournalPageIfRequired(pPg);
    if (iVar5 != 0) {
      return iVar5;
    }
    uVar2 = pPg->flags;
  }
  local_58 = 0;
  if ((isCommit == 0) && ((uVar2 & 8) != 0)) {
    local_58 = pPg->pgno;
  }
  pPg->flags = uVar2 & 0xfff7;
  p = sqlite3PagerLookup(pPager,iFreePage);
  if (p != (DbPage *)0x0) {
    if (1 < p->nRef) {
      sqlite3PagerUnrefNotNull(p);
      iVar5 = 0xe1a2;
      goto LAB_00137ddc;
    }
    pPg->flags = pPg->flags | p->flags & 8;
    if (pPager->tempFile == '\0') {
      sqlite3PcacheDrop(p);
    }
    else {
      sqlite3PcacheMove(p,pPager->dbSize + 1);
    }
  }
  PVar4 = pPg->pgno;
  sqlite3PcacheMove(pPg,iFreePage);
  sqlite3PcacheMakeDirty(pPg);
  if ((p != (DbPage *)0x0) && (pPager->tempFile != '\0')) {
    sqlite3PcacheMove(p,PVar4);
    sqlite3PagerUnrefNotNull(p);
  }
  PVar4 = local_58;
  if (local_58 != 0) {
    iVar5 = (*pPager->xGet)(pPager,local_58,(DbPage **)&local_50,0);
    if (iVar5 != 0) {
      if (pPager->dbOrigSize < PVar4) {
        return iVar5;
      }
      sqlite3BitvecClear(pPager->pInJournal,PVar4,pPager->pTmpSpace);
      return iVar5;
    }
    *(u16 *)(local_50.nKey + 0x34) = *(u16 *)(local_50.nKey + 0x34) | 8;
    sqlite3PcacheMakeDirty((PgHdr *)local_50.nKey);
    sqlite3PagerUnrefNotNull((DbPage *)local_50.nKey);
  }
  local_5c = 0;
  pDbPage->pgno = iFreePage;
  if ((eType & 0xfb) == 1) {
    iVar5 = setChildPtrmaps(pDbPage);
    if (iVar5 != 0) {
      return iVar5;
    }
    if (eType == '\x01') {
      return 0;
    }
  }
  else {
    uVar6 = sqlite3Get4byte(pDbPage->aData);
    if ((uVar6 != 0) && (ptrmapPut(pBt,uVar6,'\x04',iFreePage,&local_5c), local_5c != 0)) {
      return local_5c;
    }
  }
  iVar5 = btreeGetPage(pBt,local_54,&pPtrPage,0);
  if (iVar5 != 0) {
    return iVar5;
  }
  iVar5 = sqlite3PagerWrite(pPtrPage->pDbPage);
  if (iVar5 != 0) {
    releasePage(pPtrPage);
    return iVar5;
  }
  if (eType == '\x04') {
    puVar8 = (uint *)pPtrPage->aData;
    uVar6 = sqlite3Get4byte((u8 *)puVar8);
    if (uVar6 == uVar3) {
      *puVar8 = iFreePage >> 0x18 | (iFreePage & 0xff0000) >> 8 | (iFreePage & 0xff00) << 8 |
                iFreePage << 0x18;
      iVar5 = 0;
    }
    else {
      iVar5 = sqlite3CorruptError(0x104ce);
    }
  }
  else if ((pPtrPage->isInit != '\0') || (iVar5 = btreeInitPage(pPtrPage), iVar5 == 0)) {
    uVar2 = pPtrPage->nCell;
    for (uVar7 = 0; uVar2 != uVar7; uVar7 = uVar7 + 1) {
      puVar8 = (uint *)(pPtrPage->aData +
                       (CONCAT11(pPtrPage->aCellIdx[uVar7 * 2],pPtrPage->aCellIdx[uVar7 * 2 + 1]) &
                       pPtrPage->maskPage));
      if (eType == '\x03') {
        (*pPtrPage->xParseCell)(pPtrPage,(u8 *)puVar8,&local_50);
        if (local_50.nLocal < local_50.nPayload) {
          puVar9 = (u8 *)((long)puVar8 + (ulong)local_50.nSize);
          if (pPtrPage->aData + pPtrPage->pBt->usableSize < puVar9) {
            iVar5 = 0x104e1;
            goto LAB_0013814d;
          }
          uVar6 = sqlite3Get4byte(puVar9 + -4);
          if (uVar6 == uVar3) {
            *(Pgno *)(puVar9 + -4) =
                 iFreePage >> 0x18 | (iFreePage & 0xff0000) >> 8 | (iFreePage & 0xff00) << 8 |
                 iFreePage << 0x18;
            goto LAB_00138167;
          }
        }
      }
      else {
        uVar6 = sqlite3Get4byte((u8 *)puVar8);
        if (uVar6 == uVar3) {
          *puVar8 = iFreePage >> 0x18 | (iFreePage & 0xff0000) >> 8 | (iFreePage & 0xff00) << 8 |
                    iFreePage << 0x18;
          goto LAB_00138167;
        }
      }
    }
    if (eType == '\x05') {
      puVar9 = pPtrPage->aData;
      bVar1 = pPtrPage->hdrOffset;
      uVar6 = sqlite3Get4byte(puVar9 + (ulong)bVar1 + 8);
      if (uVar6 == uVar3) {
        *(Pgno *)(puVar9 + (ulong)bVar1 + 8) =
             iFreePage >> 0x18 | (iFreePage & 0xff0000) >> 8 | (iFreePage & 0xff00) << 8 |
             iFreePage << 0x18;
LAB_00138167:
        iVar5 = 0;
        goto LAB_0013816f;
      }
    }
    iVar5 = 0x104f3;
LAB_0013814d:
    iVar5 = sqlite3CorruptError(iVar5);
  }
LAB_0013816f:
  local_5c = iVar5;
  releasePage(pPtrPage);
  if (iVar5 == 0) {
    ptrmapPut(pBt,iFreePage,eType,local_54,&local_5c);
    iVar5 = local_5c;
  }
  return iVar5;
}

Assistant:

static int relocatePage(
  BtShared *pBt,           /* Btree */
  MemPage *pDbPage,        /* Open page to move */
  u8 eType,                /* Pointer map 'type' entry for pDbPage */
  Pgno iPtrPage,           /* Pointer map 'page-no' entry for pDbPage */
  Pgno iFreePage,          /* The location to move pDbPage to */
  int isCommit             /* isCommit flag passed to sqlite3PagerMovepage */
){
  MemPage *pPtrPage;   /* The page that contains a pointer to pDbPage */
  Pgno iDbPage = pDbPage->pgno;
  Pager *pPager = pBt->pPager;
  int rc;

  assert( eType==PTRMAP_OVERFLOW2 || eType==PTRMAP_OVERFLOW1 || 
      eType==PTRMAP_BTREE || eType==PTRMAP_ROOTPAGE );
  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( pDbPage->pBt==pBt );
  if( iDbPage<3 ) return SQLITE_CORRUPT_BKPT;

  /* Move page iDbPage from its current location to page number iFreePage */
  TRACE(("AUTOVACUUM: Moving %d to free page %d (ptr page %d type %d)\n", 
      iDbPage, iFreePage, iPtrPage, eType));
  rc = sqlite3PagerMovepage(pPager, pDbPage->pDbPage, iFreePage, isCommit);
  if( rc!=SQLITE_OK ){
    return rc;
  }
  pDbPage->pgno = iFreePage;

  /* If pDbPage was a btree-page, then it may have child pages and/or cells
  ** that point to overflow pages. The pointer map entries for all these
  ** pages need to be changed.
  **
  ** If pDbPage is an overflow page, then the first 4 bytes may store a
  ** pointer to a subsequent overflow page. If this is the case, then
  ** the pointer map needs to be updated for the subsequent overflow page.
  */
  if( eType==PTRMAP_BTREE || eType==PTRMAP_ROOTPAGE ){
    rc = setChildPtrmaps(pDbPage);
    if( rc!=SQLITE_OK ){
      return rc;
    }
  }else{
    Pgno nextOvfl = get4byte(pDbPage->aData);
    if( nextOvfl!=0 ){
      ptrmapPut(pBt, nextOvfl, PTRMAP_OVERFLOW2, iFreePage, &rc);
      if( rc!=SQLITE_OK ){
        return rc;
      }
    }
  }

  /* Fix the database pointer on page iPtrPage that pointed at iDbPage so
  ** that it points at iFreePage. Also fix the pointer map entry for
  ** iPtrPage.
  */
  if( eType!=PTRMAP_ROOTPAGE ){
    rc = btreeGetPage(pBt, iPtrPage, &pPtrPage, 0);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    rc = sqlite3PagerWrite(pPtrPage->pDbPage);
    if( rc!=SQLITE_OK ){
      releasePage(pPtrPage);
      return rc;
    }
    rc = modifyPagePointer(pPtrPage, iDbPage, iFreePage, eType);
    releasePage(pPtrPage);
    if( rc==SQLITE_OK ){
      ptrmapPut(pBt, iFreePage, eType, iPtrPage, &rc);
    }
  }
  return rc;
}